

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

shared_ptr<Assimp::FIBase64Value> __thiscall
Assimp::FIBase64Value::create
          (FIBase64Value *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Assimp::FIBase64Value> sVar1;
  undefined1 local_29;
  FIValue local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_28._vptr_FIValue = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Assimp::FIBase64ValueImpl,std::allocator<Assimp::FIBase64ValueImpl>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&local_20,(FIBase64ValueImpl **)&local_28,
             (allocator<Assimp::FIBase64ValueImpl> *)&local_29,value);
  (this->super_FIByteValue).super_FIValue._vptr_FIValue = local_28._vptr_FIValue;
  (this->super_FIByteValue).value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_FIByteValue).value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_20._M_pi;
  sVar1.super___shared_ptr<Assimp::FIBase64Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Assimp::FIBase64Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Assimp::FIBase64Value>)
         sVar1.super___shared_ptr<Assimp::FIBase64Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FIBase64Value> FIBase64Value::create(std::vector<uint8_t> &&value) {
    return std::make_shared<FIBase64ValueImpl>(std::move(value));
}